

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

timeval absl::lts_20250127::ToTimeval(Time t)

{
  undefined1 auVar1 [16];
  uint32_t in_EDX;
  timespec tVar2;
  timeval tVar3;
  Time t_00;
  
  t_00.rep_.rep_hi_.hi_ = (uint32_t)((ulong)register0x00000030 >> 0x20);
  t_00.rep_.rep_hi_.lo_ = t.rep_.rep_lo_;
  t_00.rep_.rep_lo_ = in_EDX;
  tVar2 = ToTimespec((lts_20250127 *)t.rep_.rep_hi_,t_00);
  tVar3.tv_sec = tVar2.tv_sec;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = tVar2.tv_nsec;
  tVar3.tv_usec._0_4_ = SUB164(auVar1 / ZEXT816(1000),0);
  tVar3.tv_usec._4_4_ = 0;
  return tVar3;
}

Assistant:

timeval ToTimeval(Time t) {
  timeval tv;
  timespec ts = absl::ToTimespec(t);
  tv.tv_sec = static_cast<decltype(tv.tv_sec)>(ts.tv_sec);
  if (tv.tv_sec != ts.tv_sec) {  // narrowing
    if (ts.tv_sec < 0) {
      tv.tv_sec = std::numeric_limits<decltype(tv.tv_sec)>::min();
      tv.tv_usec = 0;
    } else {
      tv.tv_sec = std::numeric_limits<decltype(tv.tv_sec)>::max();
      tv.tv_usec = 1000 * 1000 - 1;
    }
    return tv;
  }
  tv.tv_usec = static_cast<int>(ts.tv_nsec / 1000);  // suseconds_t
  return tv;
}